

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

LoopEntryPointInfo * __thiscall
Js::FunctionBody::GetLoopEntryPointInfoFromNativeAddress
          (FunctionBody *this,DWORD_PTR codeAddress,uint loopNum)

{
  code *pcVar1;
  anon_class_16_2_b55a620e fn;
  bool bVar2;
  LoopHeader *this_00;
  undefined4 *puVar3;
  LoopHeader *loopHeader;
  LoopEntryPointInfo *entryPoint;
  DWORD_PTR DStack_18;
  uint loopNum_local;
  DWORD_PTR codeAddress_local;
  FunctionBody *this_local;
  
  loopHeader = (LoopHeader *)0x0;
  entryPoint._4_4_ = loopNum;
  DStack_18 = codeAddress;
  codeAddress_local = (DWORD_PTR)this;
  this_00 = GetLoopHeader(this,loopNum);
  if (this_00 == (LoopHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xd26,"(loopHeader)","loopHeader");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  fn.entryPoint = (LoopEntryPointInfo **)&loopHeader;
  fn.codeAddress = &stack0xffffffffffffffe8;
  LoopHeader::
  MapEntryPoints<Js::FunctionBody::GetLoopEntryPointInfoFromNativeAddress(unsigned_long,unsigned_int)const::__0>
            (this_00,fn);
  return (LoopEntryPointInfo *)loopHeader;
}

Assistant:

LoopEntryPointInfo * FunctionBody::GetLoopEntryPointInfoFromNativeAddress(DWORD_PTR codeAddress, uint loopNum) const
    {
        LoopEntryPointInfo * entryPoint = nullptr;

        LoopHeader * loopHeader = this->GetLoopHeader(loopNum);
        Assert(loopHeader);

        loopHeader->MapEntryPoints([&](int index, LoopEntryPointInfo * currentEntryPoint)
        {
            if (currentEntryPoint->IsCodeGenDone() &&
                codeAddress >= currentEntryPoint->GetNativeAddress() &&
                codeAddress < currentEntryPoint->GetNativeAddress() + currentEntryPoint->GetCodeSize())
            {
                entryPoint = currentEntryPoint;
            }
        });

        return entryPoint;
    }